

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

int Sbd_CutSetCheckArray(Sbd_Cut_t **ppCuts,int nCuts)

{
  Sbd_Cut_t *pCut;
  word wVar1;
  int iVar2;
  word wVar3;
  int local_38;
  int Value;
  int n;
  int m;
  int k;
  int i;
  Sbd_Cut_t *pCut1;
  Sbd_Cut_t *pCut0;
  int nCuts_local;
  Sbd_Cut_t **ppCuts_local;
  
  if (nCuts < 1) {
    __assert_fail("nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x7a,"int Sbd_CutSetCheckArray(Sbd_Cut_t **, int)");
  }
  m = 0;
  while( true ) {
    if (nCuts <= m) {
      return 1;
    }
    pCut = ppCuts[m];
    if (10 < *(uint *)&pCut->field_0x14 >> 0x1c) break;
    wVar1 = pCut->Sign;
    wVar3 = Sbd_CutGetSign(pCut);
    if (wVar1 != wVar3) {
      __assert_fail("pCut0->Sign == Sbd_CutGetSign(pCut0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                    ,0x7f,"int Sbd_CutSetCheckArray(Sbd_Cut_t **, int)");
    }
    for (Value = 0; local_38 = Value, Value < (int)(*(uint *)&pCut->field_0x14 >> 0x1c);
        Value = Value + 1) {
      while (local_38 = local_38 + 1, local_38 < (int)(*(uint *)&pCut->field_0x14 >> 0x1c)) {
        if (pCut->pLeaves[local_38] <= pCut->pLeaves[Value]) {
          __assert_fail("pCut0->pLeaves[m] < pCut0->pLeaves[n]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                        ,0x83,"int Sbd_CutSetCheckArray(Sbd_Cut_t **, int)");
        }
      }
    }
    for (n = 0; n < nCuts; n = n + 1) {
      if ((pCut != ppCuts[n]) && (iVar2 = Sbd_CutCheck(pCut,ppCuts[n]), iVar2 != 0)) {
        __assert_fail("Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                      ,0x8c,"int Sbd_CutSetCheckArray(Sbd_Cut_t **, int)");
      }
    }
    m = m + 1;
  }
  __assert_fail("pCut0->nLeaves <= SBD_MAX_CUTSIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                ,0x7e,"int Sbd_CutSetCheckArray(Sbd_Cut_t **, int)");
}

Assistant:

static inline int Sbd_CutSetCheckArray( Sbd_Cut_t ** ppCuts, int nCuts )
{
    Sbd_Cut_t * pCut0, * pCut1; 
    int i, k, m, n, Value;
    assert( nCuts > 0 );
    for ( i = 0; i < nCuts; i++ )
    {
        pCut0 = ppCuts[i];
        assert( pCut0->nLeaves <= SBD_MAX_CUTSIZE );
        assert( pCut0->Sign == Sbd_CutGetSign(pCut0) );
        // check duplicates
        for ( m = 0; m < (int)pCut0->nLeaves; m++ )
        for ( n = m + 1; n < (int)pCut0->nLeaves; n++ )
            assert( pCut0->pLeaves[m] < pCut0->pLeaves[n] );
        // check pairs
        for ( k = 0; k < nCuts; k++ )
        {
            pCut1 = ppCuts[k];
            if ( pCut0 == pCut1 )
                continue;
            // check containments
            Value = Sbd_CutCheck( pCut0, pCut1 );
            assert( Value == 0 );
        }
    }
    return 1;
}